

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_bnot(lua_State *L,TValue *ra,TValue *rb)

{
  int iVar1;
  TValue *pTVar2;
  lua_Integer ib;
  
  pTVar2 = rb;
  if ((rb->tt_ != 0x13) &&
     (iVar1 = luaV_tointegerns(rb,&ib,F2Ieq), pTVar2 = (TValue *)&ib, iVar1 == 0)) {
    luaT_trybinTM(L,rb,rb,ra,TM_BNOT);
    return;
  }
  (ra->value_).i = ~(pTVar2->value_).i;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_bnot(lua_State *L, TValue *ra, TValue *rb) {
  lua_Integer ib;
  if (tointegerns(rb, &ib)) { setivalue(ra, intop (^, ~l_castS2U(0), ib)); }
  else {
    luaT_trybinTM(L, rb, rb, ra, TM_BNOT);
  }
}